

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaStg.c
# Opt level: O0

Gia_Man_t * Gia_ManStgKHot(Vec_Int_t *vLines,int nIns,int nOuts,int nStates,int kHot,int fVerbose)

{
  Gia_Man_t *pGVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  char *pcVar6;
  int iOut;
  int iNext;
  int iCur;
  int iMint;
  int Lit;
  int LitC;
  int nBits;
  int k;
  int b;
  int i;
  Vec_Vec_t *vCodes;
  Vec_Vec_t *vLitsOuts;
  Vec_Vec_t *vLitsNext;
  Vec_Int_t *vVec;
  Vec_Int_t *vCurs;
  Vec_Int_t *vInMints;
  Gia_Man_t *pTemp;
  Gia_Man_t *p;
  int local_20;
  int fVerbose_local;
  int kHot_local;
  int nStates_local;
  int nOuts_local;
  int nIns_local;
  Vec_Int_t *vLines_local;
  
  p._4_4_ = fVerbose;
  local_20 = kHot;
  fVerbose_local = nStates;
  kHot_local = nOuts;
  nStates_local = nIns;
  _nOuts_local = vLines;
  iVar2 = Vec_IntSize(vLines);
  if (iVar2 % 4 != 0) {
    __assert_fail("Vec_IntSize(vLines) % 4 == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaStg.c"
                  ,0xdd,"Gia_Man_t *Gia_ManStgKHot(Vec_Int_t *, int, int, int, int, int)");
  }
  _b = Gia_ManAssignCodes(local_20,fVerbose_local,&Lit);
  iVar2 = Vec_VecSize(_b);
  if (iVar2 != fVerbose_local) {
    __assert_fail("Vec_VecSize(vCodes) == nStates",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaStg.c"
                  ,0xe1,"Gia_Man_t *Gia_ManStgKHot(Vec_Int_t *, int, int, int, int, int)");
  }
  if (p._4_4_ != 0) {
    Gia_ManPrintStateEncoding(_b,Lit);
  }
  pTemp = Gia_ManStart(10000);
  pcVar6 = Abc_UtilStrsav("stg");
  pTemp->pName = pcVar6;
  for (k = 0; k < nStates_local + Lit; k = k + 1) {
    Gia_ManAppendCi(pTemp);
  }
  Gia_ManHashAlloc(pTemp);
  vCurs = Vec_IntAlloc(1 << ((byte)nStates_local & 0x1f));
  for (k = 0; k < 1 << ((byte)nStates_local & 0x1f); k = k + 1) {
    iCur = 1;
    for (nBits = 0; pGVar1 = pTemp, nBits < nStates_local; nBits = nBits + 1) {
      iVar2 = Abc_Var2Lit(nBits + 1,(uint)(((k >> ((byte)nBits & 0x1f) & 1U) != 0 ^ 0xffU) & 1));
      iCur = Gia_ManHashAnd(pGVar1,iCur,iVar2);
    }
    Vec_IntPush(vCurs,iCur);
  }
  vVec = Vec_IntAlloc(fVerbose_local);
  for (k = 0; iVar2 = k, iVar3 = Vec_VecSize(_b), iVar2 < iVar3; k = k + 1) {
    vLitsNext = (Vec_Vec_t *)Vec_VecEntryInt(_b,k);
    iCur = 1;
    for (LitC = 0; iVar2 = LitC, iVar3 = Vec_IntSize((Vec_Int_t *)vLitsNext), iVar2 < iVar3;
        LitC = LitC + 1) {
      nBits = Vec_IntEntry((Vec_Int_t *)vLitsNext,LitC);
      pGVar1 = pTemp;
      if ((nBits < 0) || (Lit <= nBits)) {
        __assert_fail("b >= 0 && b < nBits",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaStg.c"
                      ,0xfc,"Gia_Man_t *Gia_ManStgKHot(Vec_Int_t *, int, int, int, int, int)");
      }
      iVar2 = Abc_Var2Lit(nStates_local + 1 + nBits,(uint)(nBits < local_20));
      iCur = Gia_ManHashAnd(pGVar1,iCur,iVar2);
    }
    Vec_IntPush(vVec,iCur);
  }
  vLitsOuts = Vec_VecStart(Lit);
  vCodes = Vec_VecStart(kHot_local);
  k = 0;
  while( true ) {
    iVar2 = k;
    iVar4 = Vec_IntSize(_nOuts_local);
    iVar3 = k;
    if (iVar4 <= iVar2) {
      Vec_IntFree(vCurs);
      Vec_IntFree(vVec);
      Vec_VecFree(_b);
      for (nBits = 0; iVar2 = nBits, iVar3 = Vec_VecSize(vCodes), iVar2 < iVar3; nBits = nBits + 1)
      {
        vLitsNext = (Vec_Vec_t *)Vec_VecEntryInt(vCodes,nBits);
        pGVar1 = pTemp;
        iVar2 = Gia_ManCreateOrGate(pTemp,(Vec_Int_t *)vLitsNext);
        Gia_ManAppendCo(pGVar1,iVar2);
      }
      Vec_VecFree(vCodes);
      for (nBits = 0; iVar2 = nBits, iVar3 = Vec_VecSize(vLitsOuts), iVar2 < iVar3;
          nBits = nBits + 1) {
        vLitsNext = (Vec_Vec_t *)Vec_VecEntryInt(vLitsOuts,nBits);
        pGVar1 = pTemp;
        iVar2 = Gia_ManCreateOrGate(pTemp,(Vec_Int_t *)vLitsNext);
        iVar2 = Abc_LitNotCond(iVar2,(uint)(nBits < local_20));
        Gia_ManAppendCo(pGVar1,iVar2);
      }
      Vec_VecFree(vLitsOuts);
      Gia_ManSetRegNum(pTemp,Lit);
      Gia_ManHashStop(pTemp);
      vInMints = (Vec_Int_t *)pTemp;
      pTemp = Gia_ManCleanup(pTemp);
      Gia_ManStop((Gia_Man_t *)vInMints);
      iVar2 = Gia_ManHasDangling(pTemp);
      if (iVar2 == 0) {
        return pTemp;
      }
      __assert_fail("!Gia_ManHasDangling(p)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaStg.c"
                    ,0x12e,"Gia_Man_t *Gia_ManStgKHot(Vec_Int_t *, int, int, int, int, int)");
    }
    k = k + 1;
    iVar3 = Vec_IntEntry(_nOuts_local,iVar3);
    iVar2 = k;
    k = k + 1;
    iVar4 = Vec_IntEntry(_nOuts_local,iVar2);
    iVar2 = k;
    k = k + 1;
    iVar5 = Vec_IntEntry(_nOuts_local,iVar2);
    iVar2 = k;
    k = k + 1;
    iVar2 = Vec_IntEntry(_nOuts_local,iVar2);
    pGVar1 = pTemp;
    if ((iVar3 < 0) || (1 << ((byte)nStates_local & 0x1f) <= iVar3)) {
      __assert_fail("iMint >= 0 && iMint < (1<<nIns)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaStg.c"
                    ,0x10b,"Gia_Man_t *Gia_ManStgKHot(Vec_Int_t *, int, int, int, int, int)");
    }
    if ((iVar4 < 0) || (fVerbose_local <= iVar4)) break;
    if ((iVar5 < 0) || (fVerbose_local <= iVar5)) {
      __assert_fail("iNext >= 0 && iNext < nStates",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaStg.c"
                    ,0x10d,"Gia_Man_t *Gia_ManStgKHot(Vec_Int_t *, int, int, int, int, int)");
    }
    if ((iVar2 < 0) || (1 << ((byte)kHot_local & 0x1f) <= iVar2)) {
      __assert_fail("iOut >= 0 && iOut < (1<<nOuts)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaStg.c"
                    ,0x10e,"Gia_Man_t *Gia_ManStgKHot(Vec_Int_t *, int, int, int, int, int)");
    }
    iVar3 = Vec_IntEntry(vCurs,iVar3);
    iVar4 = Vec_IntEntry(vVec,iVar4);
    iVar3 = Gia_ManHashAnd(pGVar1,iVar3,iVar4);
    vLitsNext = (Vec_Vec_t *)Vec_VecEntryInt(_b,iVar5);
    for (LitC = 0; iVar4 = LitC, iVar5 = Vec_IntSize((Vec_Int_t *)vLitsNext), iVar4 < iVar5;
        LitC = LitC + 1) {
      nBits = Vec_IntEntry((Vec_Int_t *)vLitsNext,LitC);
      Vec_VecPushInt(vLitsOuts,nBits,iVar3);
    }
    for (nBits = 0; nBits < kHot_local; nBits = nBits + 1) {
      if ((iVar2 >> ((byte)nBits & 0x1f) & 1U) != 0) {
        Vec_VecPushInt(vCodes,nBits,iVar3);
      }
    }
  }
  __assert_fail("iCur >= 0 && iCur < nStates",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaStg.c"
                ,0x10c,"Gia_Man_t *Gia_ManStgKHot(Vec_Int_t *, int, int, int, int, int)");
}

Assistant:

Gia_Man_t * Gia_ManStgKHot( Vec_Int_t * vLines, int nIns, int nOuts, int nStates, int kHot, int fVerbose )
{
    Gia_Man_t * p, * pTemp;
    Vec_Int_t * vInMints, * vCurs, * vVec;
    Vec_Vec_t * vLitsNext, * vLitsOuts, * vCodes;
    int i, b, k, nBits, LitC, Lit;
    assert( Vec_IntSize(vLines) % 4 == 0 );

    // produce state encoding
    vCodes = Gia_ManAssignCodes( kHot, nStates, &nBits );
    assert( Vec_VecSize(vCodes) == nStates );
    if ( fVerbose )
        Gia_ManPrintStateEncoding( vCodes, nBits );

    // start manager
    p = Gia_ManStart( 10000 );
    p->pName = Abc_UtilStrsav( "stg" );
    for ( i = 0; i < nIns + nBits; i++ )
        Gia_ManAppendCi(p);

    // create input minterms
    Gia_ManHashAlloc( p );
    vInMints = Vec_IntAlloc( 1 << nIns );
    for ( i = 0; i < (1 << nIns); i++ )
    {
        for ( Lit = 1, b = 0; b < nIns; b++ )
            Lit = Gia_ManHashAnd( p, Lit, Abc_Var2Lit( b+1, !((i >> b) & 1) ) );
        Vec_IntPush( vInMints, Lit );
    } 

    // create current states
    vCurs  = Vec_IntAlloc( nStates );
    Vec_VecForEachLevelInt( vCodes, vVec, i )
    {
        Lit = 1;
        Vec_IntForEachEntry( vVec, b, k )
        {
            assert( b >= 0 && b < nBits );
            Lit = Gia_ManHashAnd( p, Lit, Abc_Var2Lit(1+nIns+b, (b<kHot)) );
        }
        Vec_IntPush( vCurs, Lit );
    }

    // go through the lines
    vLitsNext = Vec_VecStart( nBits );
    vLitsOuts = Vec_VecStart( nOuts );
    for ( i = 0; i < Vec_IntSize(vLines); )
    {
        int iMint = Vec_IntEntry(vLines, i++);
        int iCur  = Vec_IntEntry(vLines, i++);
        int iNext = Vec_IntEntry(vLines, i++);
        int iOut  = Vec_IntEntry(vLines, i++);
        assert( iMint >= 0 && iMint < (1<<nIns)  );
        assert( iCur  >= 0 && iCur  < nStates    );
        assert( iNext >= 0 && iNext < nStates    );
        assert( iOut  >= 0 && iOut  < (1<<nOuts) );
        // create condition
        LitC = Gia_ManHashAnd( p, Vec_IntEntry(vInMints, iMint), Vec_IntEntry(vCurs, iCur) );
        // update next state
//        Vec_VecPushInt( vLitsNext, iNext, LitC );
        vVec = (Vec_Int_t *)Vec_VecEntryInt( vCodes, iNext );
        Vec_IntForEachEntry( vVec, b, k )
            Vec_VecPushInt( vLitsNext, b, LitC );
        // update outputs
        for ( b = 0; b < nOuts; b++ )
            if ( (iOut >> b) & 1 ) 
                Vec_VecPushInt( vLitsOuts, b, LitC );
    }
    Vec_IntFree( vInMints );
    Vec_IntFree( vCurs );
    Vec_VecFree( vCodes );

    // create POs
    Vec_VecForEachLevelInt( vLitsOuts, vVec, b )
        Gia_ManAppendCo( p, Gia_ManCreateOrGate(p, vVec) );
    Vec_VecFree( vLitsOuts );

    // create next states
    Vec_VecForEachLevelInt( vLitsNext, vVec, b )
        Gia_ManAppendCo( p, Abc_LitNotCond( Gia_ManCreateOrGate(p, vVec), (b<kHot) ) );
    Vec_VecFree( vLitsNext );

    Gia_ManSetRegNum( p, nBits );
    Gia_ManHashStop( p );

    p = Gia_ManCleanup( pTemp = p );
    Gia_ManStop( pTemp );
    assert( !Gia_ManHasDangling(p) );
    return p;
}